

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VkBootstrap.h
# Opt level: O1

void __thiscall
vkb::detail::GenericFeatureChain::add<VkPhysicalDeviceVulkan12Features>
          (GenericFeatureChain *this,VkPhysicalDeviceVulkan12Features *features)

{
  pointer *ppGVar1;
  VkStructureType VVar2;
  GenericFeaturesPNextNode *pGVar3;
  iterator __position;
  vector<vkb::detail::GenericFeaturesPNextNode,_std::allocator<vkb::detail::GenericFeaturesPNextNode>_>
  *__range3;
  GenericFeaturesPNextNode *this_00;
  bool bVar4;
  GenericFeaturesPNextNode local_438;
  
  this_00 = (this->nodes).
            super__Vector_base<vkb::detail::GenericFeaturesPNextNode,_std::allocator<vkb::detail::GenericFeaturesPNextNode>_>
            ._M_impl.super__Vector_impl_data._M_start;
  pGVar3 = (this->nodes).
           super__Vector_base<vkb::detail::GenericFeaturesPNextNode,_std::allocator<vkb::detail::GenericFeaturesPNextNode>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  bVar4 = this_00 == pGVar3;
  if (!bVar4) {
    VVar2 = this_00->sType;
    while (features->sType != VVar2) {
      this_00 = this_00 + 1;
      bVar4 = this_00 == pGVar3;
      if (bVar4) goto LAB_00129fc7;
      VVar2 = this_00->sType;
    }
    local_438.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
    memset(&local_438.pNext,0,0x408);
    memcpy(&local_438,features,0xd0);
    GenericFeaturesPNextNode::combine(this_00,&local_438);
    if (!bVar4) {
      return;
    }
  }
LAB_00129fc7:
  local_438.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  memset(&local_438.pNext,0,0x408);
  memcpy(&local_438,features,0xd0);
  __position._M_current =
       (this->nodes).
       super__Vector_base<vkb::detail::GenericFeaturesPNextNode,_std::allocator<vkb::detail::GenericFeaturesPNextNode>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (this->nodes).
      super__Vector_base<vkb::detail::GenericFeaturesPNextNode,_std::allocator<vkb::detail::GenericFeaturesPNextNode>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::
    vector<vkb::detail::GenericFeaturesPNextNode,_std::allocator<vkb::detail::GenericFeaturesPNextNode>_>
    ::_M_realloc_insert<vkb::detail::GenericFeaturesPNextNode>(&this->nodes,__position,&local_438);
  }
  else {
    memcpy(__position._M_current,&local_438,0x410);
    ppGVar1 = &(this->nodes).
               super__Vector_base<vkb::detail::GenericFeaturesPNextNode,_std::allocator<vkb::detail::GenericFeaturesPNextNode>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    *ppGVar1 = *ppGVar1 + 1;
  }
  return;
}

Assistant:

void add(T const& features) noexcept {
        // If this struct is already in the list, combine it
        for (auto& node : nodes) {
            if (static_cast<VkStructureType>(features.sType) == node.sType) {
                node.combine(features);
                return;
            }
        }
        // Otherwise append to the end
        nodes.push_back(features);
    }